

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,DenseMatrix *wordVectors)

{
  int32_t iVar1;
  long i;
  real rVar2;
  Vector vec;
  string word;
  _Vector_base<float,_std::allocator<float>_> local_60;
  string local_48;
  
  Vector::Vector((Vector *)&local_60,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  DenseMatrix::zero(wordVectors);
  i = 0;
  while( true ) {
    iVar1 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (iVar1 <= i) break;
    Dictionary::getWord_abi_cxx11_
              (&local_48,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int32_t)i);
    getWordVector(this,(Vector *)&local_60,&local_48);
    rVar2 = Vector::norm((Vector *)&local_60);
    if (0.0 < rVar2) {
      DenseMatrix::addVectorToRow(wordVectors,(Vector *)&local_60,i,1.0 / rVar2);
    }
    std::__cxx11::string::~string((string *)&local_48);
    i = i + 1;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void FastText::precomputeWordVectors(DenseMatrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addVectorToRow(vec, i, 1.0 / norm);
    }
  }
}